

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_optimize.cc
# Opt level: O2

void __thiscall pass_remove_empty_switch_one_Test::TestBody(pass_remove_empty_switch_one_Test *this)

{
  undefined1 auVar1 [8];
  Generator *this_00;
  Var *var;
  char *message;
  undefined1 local_1a8 [8];
  Context c;
  shared_ptr<kratos::SequentialStmtBlock> seq;
  undefined1 local_68 [8];
  shared_ptr<kratos::SwitchStmt> case_;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  
  kratos::Context::Context((Context *)local_1a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&c.tracked_generators_._M_h._M_single_bucket,"mod",
             (allocator<char> *)local_68);
  this_00 = kratos::Context::generator
                      ((Context *)local_1a8,(string *)&c.tracked_generators_._M_h._M_single_bucket);
  std::__cxx11::string::~string((string *)&c.tracked_generators_._M_h._M_single_bucket);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&c.tracked_generators_._M_h._M_single_bucket,"out",
             (allocator<char> *)local_68);
  var = kratos::Generator::var(this_00,(string *)&c.tracked_generators_._M_h._M_single_bucket,1);
  std::__cxx11::string::~string((string *)&c.tracked_generators_._M_h._M_single_bucket);
  kratos::Generator::sequential((Generator *)&c.tracked_generators_._M_h._M_single_bucket);
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)local_38,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &var->super_enable_shared_from_this<kratos::Var>);
  std::make_shared<kratos::SwitchStmt,std::shared_ptr<kratos::Var>>
            ((shared_ptr<kratos::Var> *)local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar);
  auVar1 = local_68;
  kratos::Const::constant(0,1,false);
  kratos::Var::as<kratos::Const>((Var *)local_38);
  kratos::Const::constant(0,1,false);
  kratos::Var::assign((Var *)local_48,var);
  case_.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._0_8_;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_;
  local_48._0_8_ = (AssertHelperData *)0x0;
  local_48._8_8_ = (pointer)0x0;
  kratos::SwitchStmt::add_switch_case
            ((SwitchStmt *)auVar1,(shared_ptr<kratos::Const> *)local_38,
             (shared_ptr<kratos::Stmt> *)
             &case_.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar);
  auVar1 = local_68;
  kratos::Const::constant(1,1,false);
  kratos::Var::as<kratos::Const>((Var *)local_38);
  std::make_shared<kratos::ScopedStmtBlock>();
  case_.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._0_8_;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_;
  local_48._0_8_ = (AssertHelperData *)0x0;
  local_48._8_8_ = (pointer)0x0;
  kratos::SwitchStmt::add_switch_case
            ((SwitchStmt *)auVar1,(shared_ptr<kratos::Const> *)local_38,
             (shared_ptr<kratos::Stmt> *)
             &case_.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar);
  std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::SwitchStmt,void>
            ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)local_38,
             (__shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2> *)local_68);
  kratos::StmtBlock::add_stmt
            ((StmtBlock *)c.tracked_generators_._M_h._M_single_bucket,
             (shared_ptr<kratos::Stmt> *)local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar);
  kratos::remove_empty_block(this_00);
  case_.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
          *)((long)local_68 + 0xf8))->_M_h)._M_before_begin._M_nxt;
  local_48._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_38,"case_->body().size()","1",
             (unsigned_long *)
             &case_.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (int *)local_48);
  if (local_38[0] == (__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>)0x0) {
    testing::Message::Message
              ((Message *)
               &case_.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x176,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)local_48,
               (Message *)
               &case_.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_48);
    if (case_.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*(case_.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_vptr__Sp_counted_base[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&case_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&seq);
  kratos::Context::~Context((Context *)local_1a8);
  return;
}

Assistant:

TEST(pass, remove_empty_switch_one) {  // NOLINT
    Context c;
    auto &mod = c.generator("mod");
    auto &out = mod.var("out", 1);
    auto seq = mod.sequential();
    auto case_ = std::make_shared<SwitchStmt>(out.shared_from_this());
    case_->add_switch_case(constant(0, 1).as<Const>(), out.assign(constant(0, 1)));
    case_->add_switch_case(constant(1, 1).as<Const>(), std::make_shared<ScopedStmtBlock>());
    seq->add_stmt(case_);
    remove_empty_block(&mod);
    EXPECT_EQ(case_->body().size(), 1);
}